

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

int64_t __thiscall
r_comp::RepliStruct::parse
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent,
          int64_t paramExpect)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint64_t uVar5;
  char *pcVar6;
  long lVar7;
  element_type *peVar8;
  bool bVar9;
  shared_ptr<r_comp::RepliStruct> local_230;
  undefined4 local_21c;
  shared_ptr<r_comp::RepliStruct> local_218;
  undefined4 local_204;
  shared_ptr<r_comp::RepliStruct> local_200;
  undefined4 local_1ec;
  shared_ptr<r_comp::RepliStruct> local_1e8;
  undefined4 local_1d4;
  shared_ptr<r_comp::RepliStruct> local_1d0;
  undefined4 local_1bc;
  shared_ptr<r_comp::RepliStruct> local_1b8;
  undefined4 local_1a4;
  shared_ptr<r_comp::RepliStruct> local_1a0;
  undefined4 local_18c;
  shared_ptr<r_comp::RepliStruct> local_188;
  undefined4 local_174;
  shared_ptr<r_comp::RepliStruct> local_170;
  undefined4 local_15c;
  shared_ptr<r_comp::RepliStruct> local_158;
  undefined4 local_144;
  shared_ptr<r_comp::RepliStruct> local_140;
  undefined4 local_12c;
  shared_ptr<r_comp::RepliStruct> local_128;
  undefined4 local_114;
  shared_ptr<r_comp::RepliStruct> local_110;
  undefined4 local_fc;
  shared_ptr<r_comp::RepliStruct> local_f8;
  undefined4 local_e4;
  shared_ptr<r_comp::RepliStruct> local_e0;
  undefined4 local_cc;
  shared_ptr<r_comp::RepliStruct> local_c8;
  undefined4 local_b8;
  byte local_a1;
  int64_t iStack_a0;
  bool expectSet;
  int64_t returnIndent;
  int64_t paramCount;
  shared_ptr<r_comp::RepliStruct> subStruct;
  string label;
  string local_60 [8];
  string str;
  char local_39;
  char tc;
  char lastcc;
  char lastc;
  char c;
  int64_t paramExpect_local;
  uint64_t *prevIndent_local;
  uint64_t *curIndent_local;
  istream *stream_local;
  RepliStruct *this_local;
  
  local_39 = '\0';
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string
            ((string *)
             &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr((shared_ptr<r_comp::RepliStruct> *)&paramCount);
  returnIndent = 0;
  iStack_a0 = 0;
  local_a1 = 0;
LAB_0018263d:
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      this_local = (RepliStruct *)0x0;
      goto LAB_0018414d;
    }
    cVar2 = std::istream::get();
    switch(cVar2) {
    case '\t':
      this->line = GlobalLine;
      std::__cxx11::string::operator+=((string *)&this->error,"Tabs chars are not permitted. ");
      this_local = (RepliStruct *)0xffffffffffffffff;
      goto LAB_0018414d;
    case '\n':
      GlobalLine = GlobalLine + 1;
    case '\r':
      while( true ) {
        bVar1 = std::ios::eof();
        bVar9 = false;
        if ((bVar1 & 1) == 0) {
          iVar4 = std::istream::peek();
          bVar9 = iVar4 < 0x20;
        }
        if (!bVar9) break;
        iVar4 = std::istream::get();
        if (iVar4 == 10) {
          GlobalLine = GlobalLine + 1;
        }
      }
      *prevIndent = *curIndent;
      uVar5 = getIndent(this,stream);
      *curIndent = uVar5;
      if (*prevIndent < *curIndent) {
        if ((local_a1 & 1) == 0) {
          local_fc = 1;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_f8);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_f8);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f8);
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(shared_ptr<r_comp::RepliStruct> *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          iStack_a0 = parse(peVar8,stream,curIndent,prevIndent,0);
          local_a1 = 0;
          if (iStack_a0 < 0) {
            this_local = (RepliStruct *)0xffffffffffffffff;
            goto LAB_0018414d;
          }
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
          if (0 < iStack_a0) {
            this_local = (RepliStruct *)(iStack_a0 + -1);
            goto LAB_0018414d;
          }
        }
        else {
          local_e4 = 2;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_e0);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_e0);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=
                    ((string *)&peVar8->label,
                     (string *)
                     &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::operator=
                    ((string *)
                     &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,"");
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          iStack_a0 = parse(peVar8,stream,curIndent,prevIndent,0);
          local_a1 = 0;
          if (iStack_a0 < 0) {
            this_local = (RepliStruct *)0xffffffffffffffff;
            goto LAB_0018414d;
          }
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
          if (0 < iStack_a0) {
            this_local = (RepliStruct *)(iStack_a0 + -1);
            goto LAB_0018414d;
          }
        }
        local_a1 = 0;
        local_39 = cVar2;
      }
      else {
        if (*curIndent < *prevIndent) {
          lVar7 = std::__cxx11::string::size();
          if (lVar7 != 0) {
            lVar7 = std::__cxx11::string::size();
            if ((lVar7 == 0) && (this->type != Set)) {
              std::__cxx11::string::operator=((string *)&this->cmd,local_60);
              std::__cxx11::string::operator=(local_60,"");
            }
            else {
              local_114 = 3;
              std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_110);
              std::shared_ptr<r_comp::RepliStruct>::operator=
                        ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_110);
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_110);
              peVar8 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&paramCount);
              peVar8->parent = this;
              std::
              vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ::push_back(&this->args,(value_type *)&paramCount);
              peVar8 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&paramCount);
              std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
              std::__cxx11::string::operator=(local_60,"");
              if ((0 < paramExpect) &&
                 (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
                this_local = (RepliStruct *)0x0;
                goto LAB_0018414d;
              }
            }
          }
          this_local = (RepliStruct *)((*prevIndent - *curIndent) + -1);
          goto LAB_0018414d;
        }
        lVar7 = std::__cxx11::string::size();
        local_39 = cVar2;
        if (lVar7 != 0) {
          lVar7 = std::__cxx11::string::size();
          if (((lVar7 == 0) && (this->type != Set)) && (this->type != Root)) {
            std::__cxx11::string::operator=((string *)&this->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
          }
          else {
            local_12c = 3;
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_128);
            std::shared_ptr<r_comp::RepliStruct>::operator=
                      ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_128);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_128);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            peVar8->parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(&this->args,(value_type *)&paramCount);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
            if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect))
            {
              this_local = (RepliStruct *)0x0;
              goto LAB_0018414d;
            }
          }
        }
      }
      break;
    default:
      std::__cxx11::string::operator+=(local_60,cVar2);
      local_39 = cVar2;
      break;
    case ' ':
      lVar7 = std::__cxx11::string::size();
      local_39 = cVar2;
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::size();
        if (((lVar7 == 0) && (this->type != Set)) && (this->type != Development)) {
          std::__cxx11::string::operator=((string *)&this->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
          if (*pcVar6 == '\"') {
            std::__cxx11::string::length();
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
            if (*pcVar6 != '\"') {
              std::__cxx11::string::operator+=(local_60,' ');
              do {
                bVar1 = std::ios::eof();
                if (((bVar1 ^ 0xff) & 1) == 0) break;
                local_39 = std::istream::get();
                std::__cxx11::string::operator+=(local_60,local_39);
              } while (local_39 != '\"');
            }
          }
          local_144 = 3;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_140);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_140);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_140);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
        }
      }
      break;
    case '!':
      if (this->type != Root) {
        std::__cxx11::string::operator+=
                  ((string *)&this->error,"Directive not allowed inside a structure. ");
        this_local = (RepliStruct *)0xffffffffffffffff;
        goto LAB_0018414d;
      }
      local_cc = 4;
      std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_c8);
      std::shared_ptr<r_comp::RepliStruct>::operator=
                ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_c8);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_c8);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      peVar8->parent = this;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(&this->args,(value_type *)&paramCount);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      bVar9 = parseDirective(peVar8,stream,curIndent,prevIndent);
      local_39 = cVar2;
      if (!bVar9) {
        this_local = (RepliStruct *)0xffffffffffffffff;
        goto LAB_0018414d;
      }
      break;
    case '(':
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        if (local_39 == ':') {
          std::__cxx11::string::operator=
                    ((string *)
                     &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          lVar7 = std::__cxx11::string::size();
          if ((lVar7 == 0) && (this->type != Set)) {
            std::__cxx11::string::operator=((string *)&this->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
          }
          else {
            local_15c = 3;
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_158);
            std::shared_ptr<r_comp::RepliStruct>::operator=
                      ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_158);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_158);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            peVar8->parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(&this->args,(value_type *)&paramCount);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
            if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect))
            {
              this_local = (RepliStruct *)0x0;
              goto LAB_0018414d;
            }
          }
        }
      }
      local_174 = 1;
      std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_170);
      std::shared_ptr<r_comp::RepliStruct>::operator=
                ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_170);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_170);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      std::__cxx11::string::operator=
                ((string *)&peVar8->label,
                 (string *)
                 &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::operator=
                ((string *)
                 &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,"");
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      peVar8->parent = this;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(&this->args,(value_type *)&paramCount);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      iStack_a0 = parse(peVar8,stream,curIndent,prevIndent,0);
      if (iStack_a0 < 0) {
        this_local = (RepliStruct *)0xffffffffffffffff;
        goto LAB_0018414d;
      }
      if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
        this_local = (RepliStruct *)0x0;
        goto LAB_0018414d;
      }
      local_39 = cVar2;
      if (0 < iStack_a0) {
        this_local = (RepliStruct *)(iStack_a0 + -1);
        goto LAB_0018414d;
      }
      break;
    case ')':
      iVar4 = std::istream::peek();
      local_39 = cVar2;
      if (iVar4 == 0x3a) {
        while( true ) {
          bVar1 = std::ios::eof();
          bVar9 = false;
          if ((bVar1 & 1) == 0) {
            local_39 = std::istream::get();
            bVar9 = ' ' < local_39;
          }
          if (!bVar9) break;
          std::__cxx11::string::operator+=((string *)&this->tail,local_39);
        }
      }
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::size();
        if ((lVar7 == 0) && (this->type != Set)) {
          std::__cxx11::string::operator=((string *)&this->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          local_18c = 3;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_188);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_188);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_188);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
        }
      }
      this_local = (RepliStruct *)0x0;
      goto LAB_0018414d;
    case ';':
      while( true ) {
        bVar1 = std::ios::eof();
        bVar9 = false;
        if ((bVar1 & 1) == 0) {
          iVar4 = std::istream::peek();
          bVar9 = iVar4 != 10;
        }
        local_39 = cVar2;
        if (!bVar9) break;
        std::istream::get();
      }
      break;
    case '[':
      if (local_39 == ':') {
        std::__cxx11::string::operator=
                  ((string *)
                   &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,local_60);
        std::__cxx11::string::operator=(local_60,"");
      }
      iVar4 = std::istream::peek();
      if (iVar4 == 0x5d) {
        std::istream::get();
        cVar3 = std::istream::peek();
        if ((cVar3 < ' ') || (cVar3 == ';')) {
          local_a1 = 1;
          local_39 = cVar2;
        }
        else if ((local_39 == ':') || (local_39 < '!')) {
          local_1ec = 2;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_1e8);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_1e8);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1e8);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=
                    ((string *)&peVar8->label,
                     (string *)
                     &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          local_39 = cVar2;
        }
        else {
          std::__cxx11::string::operator+=(local_60,"[]");
          local_39 = cVar2;
        }
      }
      else {
        lVar7 = std::__cxx11::string::size();
        if (lVar7 != 0) {
          lVar7 = std::__cxx11::string::size();
          if ((lVar7 == 0) && (this->type != Set)) {
            std::__cxx11::string::operator=((string *)&this->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
          }
          else {
            local_204 = 3;
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_200);
            std::shared_ptr<r_comp::RepliStruct>::operator=
                      ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_200);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_200);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            peVar8->parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(&this->args,(value_type *)&paramCount);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
            if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect))
            {
              this_local = (RepliStruct *)0x0;
              goto LAB_0018414d;
            }
          }
        }
        local_21c = 2;
        std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_218);
        std::shared_ptr<r_comp::RepliStruct>::operator=
                  ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_218);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_218);
        peVar8 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&paramCount);
        peVar8->parent = this;
        peVar8 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&paramCount);
        std::__cxx11::string::operator=
                  ((string *)&peVar8->label,
                   (string *)
                   &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::operator=
                  ((string *)
                   &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,"");
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(&this->args,(value_type *)&paramCount);
        peVar8 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&paramCount);
        iStack_a0 = parse(peVar8,stream,curIndent,prevIndent,0);
        if (iStack_a0 < 0) {
          this_local = (RepliStruct *)0xffffffffffffffff;
          goto LAB_0018414d;
        }
        if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
          this_local = (RepliStruct *)0x0;
          goto LAB_0018414d;
        }
        local_39 = cVar2;
        if (0 < iStack_a0) {
          this_local = (RepliStruct *)(iStack_a0 + -1);
          goto LAB_0018414d;
        }
      }
      break;
    case ']':
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::size();
        if ((lVar7 == 0) && (this->type != Set)) {
          std::__cxx11::string::operator=((string *)&this->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_230);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_230);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_230);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
        }
      }
      this_local = (RepliStruct *)0x0;
      goto LAB_0018414d;
    case '{':
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        if (local_39 == ':') {
          std::__cxx11::string::operator=
                    ((string *)
                     &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          lVar7 = std::__cxx11::string::size();
          if ((lVar7 == 0) && (this->type != Set)) {
            std::__cxx11::string::operator=((string *)&this->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
          }
          else {
            local_1a4 = 3;
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_1a0);
            std::shared_ptr<r_comp::RepliStruct>::operator=
                      ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_1a0);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1a0);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            peVar8->parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(&this->args,(value_type *)&paramCount);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&paramCount);
            std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
            std::__cxx11::string::operator=(local_60,"");
            if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect))
            {
              this_local = (RepliStruct *)0x0;
              goto LAB_0018414d;
            }
          }
        }
      }
      local_1bc = 6;
      std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_1b8);
      std::shared_ptr<r_comp::RepliStruct>::operator=
                ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_1b8);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1b8);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      std::__cxx11::string::operator=
                ((string *)&peVar8->label,
                 (string *)
                 &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::operator=
                ((string *)
                 &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,"");
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      peVar8->parent = this;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(&this->args,(value_type *)&paramCount);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&paramCount);
      iStack_a0 = parse(peVar8,stream,curIndent,prevIndent,0);
      if (iStack_a0 < 0) {
        this_local = (RepliStruct *)0xffffffffffffffff;
      }
      else {
        if ((paramExpect < 1) || (returnIndent = returnIndent + 1, returnIndent != paramExpect))
        goto LAB_0018391d;
        this_local = (RepliStruct *)0x0;
      }
      goto LAB_0018414d;
    case '|':
      iVar4 = std::istream::peek();
      if (iVar4 == 0x5b) {
        std::istream::get();
        std::istream::get();
        std::__cxx11::string::operator+=(local_60,"|[]");
        local_39 = cVar2;
      }
      else {
        std::__cxx11::string::operator+=(local_60,cVar2);
        local_39 = cVar2;
      }
      break;
    case '}':
      iVar4 = std::istream::peek();
      local_39 = cVar2;
      if (iVar4 == 0x3a) {
        while( true ) {
          bVar1 = std::ios::eof();
          bVar9 = false;
          if ((bVar1 & 1) == 0) {
            local_39 = std::istream::get();
            bVar9 = ' ' < local_39;
          }
          if (!bVar9) break;
          std::__cxx11::string::operator+=((string *)&this->tail,local_39);
        }
      }
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::size();
        if (((lVar7 == 0) && (this->type != Set)) && (this->type != Development)) {
          std::__cxx11::string::operator=((string *)&this->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
        }
        else {
          local_1d4 = 3;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_1d0);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    ((shared_ptr<r_comp::RepliStruct> *)&paramCount,&local_1d0);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1d0);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          peVar8->parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(&this->args,(value_type *)&paramCount);
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&paramCount);
          std::__cxx11::string::operator=((string *)&peVar8->cmd,local_60);
          std::__cxx11::string::operator=(local_60,"");
          if ((0 < paramExpect) && (returnIndent = returnIndent + 1, returnIndent == paramExpect)) {
            this_local = (RepliStruct *)0x0;
            goto LAB_0018414d;
          }
        }
      }
      this_local = (RepliStruct *)0x0;
      goto LAB_0018414d;
    }
  } while( true );
LAB_0018391d:
  local_39 = cVar2;
  if (0 < iStack_a0) {
    this_local = (RepliStruct *)(iStack_a0 + -1);
LAB_0018414d:
    local_b8 = 1;
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)&paramCount);
    std::__cxx11::string::~string
              ((string *)
               &subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string(local_60);
    return (int64_t)this_local;
  }
  goto LAB_0018263d;
}

Assistant:

int64_t RepliStruct::parse(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent, int64_t paramExpect)
{
    char c = 0, lastc = 0, lastcc, tc;
    std::string str, label;
    std::shared_ptr<RepliStruct> subStruct;
    int64_t paramCount = 0;
    int64_t returnIndent = 0;
    bool expectSet = false;

    while (!stream->eof()) {
        lastcc = lastc;
        lastc = c;
        c = stream->get();

        // printf("%c", c);
        switch (c) {
        case '\t':
            line = GlobalLine;
            error += "Tabs chars are not permitted. ";
            return -1;

        case '!':
            if (this->type == Root) {
                subStruct = std::make_shared<RepliStruct>(Directive);
                subStruct->parent = this;
                args.push_back(subStruct);

                if (!subStruct->parseDirective(stream, curIndent, prevIndent)) {
                    return -1;
                }
            } else {
                error += "Directive not allowed inside a structure. ";
                return -1;
            }

            break;

        case '\n':
            GlobalLine++;

        case '\r':

            // skip all CR and LF
            while ((!stream->eof()) && (stream->peek() < 32))
                if (stream->get() == '\n') {
                    GlobalLine++;
                }

            // get indents
            prevIndent = curIndent;
            curIndent = getIndent(stream);

            // Are we in a parenthesis or set
            if (curIndent > prevIndent) {
                // Are we in a set
                if (expectSet) {
                    // Add new sub structure
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    label = "";
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
                // or a parenthesis
                else {
                    subStruct = std::make_shared<RepliStruct>(Structure);
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
            } else if (curIndent < prevIndent) {
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                // current structure or set is complete
                return prevIndent - curIndent - 1;
            } else {
                // act as if we met a space
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set) || (type == Root)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }
            }

            break;

        case ';': // Comments
            while (!stream->eof() && stream->peek() != '\n') {
                stream->get(); // discard
            }

            break;

        case ' ':

            // next string is ready
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    // Check if we need to read more tokens for the string
                    if (str[0] == '"' && str[str.length() - 1] != '"') {
                        str += ' ';

                        while (!stream->eof()) {
                            c = stream->get();
                            str += c;

                            if (c == '"') {
                                break;
                            }
                        }
                    }

                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            break;

        case '(':

            // Check for scenario 'xxx('
            if (str.size() > 0) {
                if (lastc == ':') { // label:(xxx)
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Structure);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case ')':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '{':

            // Check for scenario 'xxx{'
            if (str.size() > 0) {
                if (lastc == ':') { // label:{xxx}
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Development);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case '}':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '|':
            if (stream->peek() == '[') {
                stream->get(); // read the [
                stream->get(); // read the ]
                str += "|[]";
            } else {
                str += c;
            }

            break;

        case '[': // set start
            if (lastc == ':') { // label:[xxx]
                label = str;
                str = "";
            }

            if (stream->peek() == ']') {
                stream->get(); // read the ]

                // if we have a <CR> or <LF> next we may have a line indent set
                if (((tc = stream->peek()) < 32) || (tc == ';')) {
                    expectSet = true;
                } else {
                    // this could be a xxx:[] or xxx[]
                    if ((lastc != ':') && (lastc > 32)) { // label[]
                        // act as if [] is part of the string and continue
                        str += "[]";
                        continue;
                    }

                    // create empty set
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    args.push_back(subStruct);
                }
            } else {
                // Check for scenario 'xxx['
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                subStruct = std::make_shared<RepliStruct>(Set);
                subStruct->parent = this;
                subStruct->label = label;
                label = "";
                args.push_back(subStruct);
                returnIndent = subStruct->parse(stream, curIndent, prevIndent);

                if (returnIndent < 0) {
                    return -1;
                }

                if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                    return 0;
                }

                if (returnIndent > 0) {
                    return (returnIndent - 1);
                }
            }

            break;

        case ']':

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        default:
            str += c;
            break;
        }
    }

    return 0;
}